

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

void polyscope::anon_unknown_1::buildWarningUI
               (string *warningBaseString,string *warningDetailString,int nRepeats)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ImVec2 *pIVar5;
  uint uVar6;
  uint __uval;
  uint __len;
  float fVar7;
  ImVec2 IVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar15 [12];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [16];
  ImVec2 warningModalSize;
  string warningRepeatString;
  string __str;
  float local_e8;
  ImVec2 local_d8;
  ImVec2 local_d0;
  long local_c8;
  ImVec2 IStack_c0;
  ImVec2 local_b8 [2];
  undefined1 local_a8 [16];
  ImVec2 local_98;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  long local_78;
  ImVec2 IStack_70;
  char *local_68 [2];
  char local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  undefined1 auVar14 [64];
  
  auVar15 = in_ZMM1._4_12_;
  auVar9._8_4_ = 0x3f000000;
  auVar9._0_8_ = 0x3f0000003f000000;
  auVar9._12_4_ = 0x3f000000;
  local_b8[0] = (ImVec2)vmovlps_avx(auVar9);
  ImGui::PushStyleVar(5,local_b8);
  ImGui::OpenPopup("WARNING");
  local_b8[0] = (ImVec2)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8);
  if (0 < nRepeats) {
    __len = 1;
    if (9 < (uint)nRepeats) {
      uVar6 = nRepeats;
      uVar2 = 4;
      do {
        __len = uVar2;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_001caf30;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_001caf30;
        }
        if (uVar6 < 10000) goto LAB_001caf30;
        bVar3 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar2 = __len + 4;
      } while (bVar3);
      __len = __len + 1;
    }
LAB_001caf30:
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct((ulong)local_68,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_68[0],__len,nRepeats);
    pIVar5 = (ImVec2 *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x29ba6d);
    IVar8 = (ImVec2)(pIVar5 + 2);
    if (*pIVar5 == IVar8) {
      local_c8 = *(long *)IVar8;
      IStack_c0 = pIVar5[3];
      local_d8 = (ImVec2)&local_c8;
    }
    else {
      local_c8 = *(long *)IVar8;
      local_d8 = *pIVar5;
    }
    local_d0 = pIVar5[1];
    *pIVar5 = IVar8;
    pIVar5[1].x = 0.0;
    pIVar5[1].y = 0.0;
    *(undefined1 *)&pIVar5[2].x = 0;
    pIVar5 = (ImVec2 *)std::__cxx11::string::append((char *)&local_d8);
    IVar8 = (ImVec2)(pIVar5 + 2);
    if (*pIVar5 == IVar8) {
      local_78 = *(long *)IVar8;
      IStack_70 = pIVar5[3];
      local_88 = (undefined1  [8])&local_78;
    }
    else {
      local_78 = *(long *)IVar8;
      local_88 = (undefined1  [8])*pIVar5;
    }
    uStack_80 = pIVar5[1];
    *pIVar5 = IVar8;
    pIVar5[1].x = 0.0;
    pIVar5[1].y = 0.0;
    *(undefined1 *)&pIVar5[2].x = 0;
    std::__cxx11::string::operator=((string *)local_b8,(string *)local_88);
    auVar14._8_56_ = extraout_var_00;
    auVar14._0_8_ = extraout_XMM1_Qa;
    auVar15 = auVar14._4_12_;
    if (local_88 != (undefined1  [8])&local_78) {
      operator_delete((void *)local_88);
    }
    if (local_d8 != (ImVec2)&local_c8) {
      operator_delete((void *)local_d8);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  IVar8 = ImGui::CalcTextSize((warningBaseString->_M_dataplus)._M_p,(char *)0x0,false,-1.0);
  local_98 = ImGui::CalcTextSize((warningDetailString->_M_dataplus)._M_p,(char *)0x0,false,-1.0);
  auVar13._0_8_ = ImGui::CalcTextSize((char *)local_b8[0],(char *)0x0,false,-1.0);
  auVar13._8_56_ = extraout_var;
  local_48 = auVar13._0_16_;
  auVar9 = vmaxss_avx(local_48,ZEXT416((uint)local_98.x));
  local_e8 = IVar8.x;
  auVar9 = vmaxss_avx(auVar9,ZEXT416((uint)local_e8));
  auVar16._0_4_ = (float)view::windowWidth / 5.0;
  auVar16._4_12_ = auVar15;
  auVar9 = vminss_avx(ZEXT416((uint)((float)view::windowWidth * 0.5)),
                      ZEXT416((uint)(auVar9._0_4_ + 50.0)));
  auVar9 = vmaxss_avx(auVar9,auVar16);
  local_d8.y = 0.0;
  local_d8.x = (float)auVar9._0_4_;
  ImGui::SetNextWindowSize(&local_d8,0);
  local_88._0_4_ = 0.74509805;
  local_88._4_4_ = 0.6509804;
  uStack_80._0_4_ = 0.0;
  uStack_80._4_4_ = 1.0;
  ImGui::PushStyleColor(0xb,(ImVec4 *)local_88);
  bVar3 = ImGui::BeginPopupModal("WARNING",(bool *)0x0,4);
  if (!bVar3) goto LAB_001cb35a;
  dVar1 = (double)(local_d8.x - local_e8) * 0.5 + -5.0;
  auVar10._0_4_ = (float)dVar1;
  auVar10._4_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar10._8_8_ = 0;
  auVar9 = vmaxss_avx(ZEXT816(0) << 0x40,auVar10);
  fVar7 = auVar9._0_4_;
  if (0.0 < fVar7) {
    ImGui::Indent(fVar7);
  }
  ImGui::TextWrapped("%s",(warningBaseString->_M_dataplus)._M_p);
  if (0.0 < fVar7) {
    ImGui::Unindent(fVar7);
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  iVar4 = std::__cxx11::string::compare((char *)warningDetailString);
  if (iVar4 != 0) {
    dVar1 = (double)(local_d8.x - local_98.x) * 0.5 + -5.0;
    auVar11._0_4_ = (float)dVar1;
    auVar11._4_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar11._8_8_ = 0;
    auVar9 = vmaxss_avx(ZEXT816(0) << 0x40,auVar11);
    fVar7 = auVar9._0_4_;
    if (0.0 < fVar7) {
      ImGui::Indent(fVar7);
    }
    ImGui::TextWrapped("%s",(warningDetailString->_M_dataplus)._M_p);
    if (0.0 < fVar7) {
      ImGui::Unindent(fVar7);
    }
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  iVar4 = std::__cxx11::string::compare((char *)local_b8);
  if (iVar4 != 0) {
    dVar1 = (double)(local_d8.x - (float)local_48._0_4_) * 0.5 + -5.0;
    auVar12._0_4_ = (float)dVar1;
    auVar12._4_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar12._8_8_ = 0;
    auVar9 = vmaxss_avx(ZEXT816(0) << 0x40,auVar12);
    fVar7 = auVar9._0_4_;
    if (0.0 < fVar7) {
      ImGui::Indent(fVar7);
    }
    ImGui::TextWrapped("%s",local_b8[0]);
    if (0.0 < fVar7) {
      ImGui::Unindent(fVar7);
    }
    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();
  }
  auVar9 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)((local_d8.x + -120.0) * 0.5)));
  fVar7 = auVar9._0_4_;
  if (0.0 < fVar7) {
    ImGui::Indent(fVar7);
  }
  local_88 = (undefined1  [8])vmovlps_avx(SUB6416(ZEXT464(0x42f00000),0));
  bVar3 = ImGui::Button("This is fine.",(ImVec2 *)local_88);
  if (bVar3) {
LAB_001cb31e:
    ImGui::CloseCurrentPopup();
    popContext();
  }
  else {
    bVar3 = ImGui::IsKeyPressed(0x20,true);
    if (bVar3) goto LAB_001cb31e;
  }
  bVar3 = ImGui::IsItemHovered(0);
  if (bVar3) {
    ImGui::SetTooltip("(space to dismiss)");
  }
  if (0.0 < fVar7) {
    ImGui::Unindent(fVar7);
  }
LAB_001cb35a:
  ImGui::EndPopup();
  ImGui::PopStyleColor(1);
  ImGui::PopStyleVar(1);
  if (local_b8[0] != (ImVec2)local_a8) {
    operator_delete((void *)local_b8[0]);
  }
  return;
}

Assistant:

void buildWarningUI(std::string warningBaseString, std::string warningDetailString, int nRepeats) {

  // Center modal window titles
  ImGui::PushStyleVar(ImGuiStyleVar_WindowTitleAlign, ImVec2(0.5, 0.5));

  // == Build the warning dialog
  ImGui::OpenPopup("WARNING");


  std::string warningRepeatString = "";
  if (nRepeats > 0) {
    warningRepeatString = "(and " + std::to_string(nRepeats) + " similar warnings)";
  }

  // Nice size for warning modal
  ImVec2 warningBaseTextSize = ImGui::CalcTextSize(warningBaseString.c_str());
  ImVec2 warningDetailTextSize = ImGui::CalcTextSize(warningDetailString.c_str());
  ImVec2 warningRepeatTextSize = ImGui::CalcTextSize(warningRepeatString.c_str());
  ImVec2 warningMaxTextSize(
      std::max(warningBaseTextSize.x, std::max(warningDetailTextSize.x, warningRepeatTextSize.x)),
      std::max(warningBaseTextSize.y, std::max(warningDetailTextSize.y, warningRepeatTextSize.y)));
  ImVec2 warningModalSize(
      std::max(view::windowWidth / 5.0f, std::min(warningMaxTextSize.x + 50, view::windowWidth / 2.0f)), 0);

  ImGui::SetNextWindowSize(warningModalSize);
  ImGui::PushStyleColor(ImGuiCol_TitleBgActive, ImVec4(190. / 255., 166. / 255., 0, 1.0));
  if (ImGui::BeginPopupModal("WARNING", NULL, ImGuiWindowFlags_NoMove)) {

    // Nice text sizing
    float offset = (warningModalSize.x - warningBaseTextSize.x) / 2.0 - 5;
    offset = std::max(offset, 0.0f);
    bool doIndent = offset > 0;
    if (doIndent) {
      ImGui::Indent(offset);
    }

    // Make base text
    ImGui::TextWrapped("%s", warningBaseString.c_str());
    if (doIndent) {
      ImGui::Unindent(offset);
    }

    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();

    // Nice text sizing
    if (warningDetailString != "") {
      offset = (warningModalSize.x - warningDetailTextSize.x) / 2.0 - 5;
      offset = std::max(offset, 0.0f);
      doIndent = offset > 0;
      if (doIndent) {
        ImGui::Indent(offset);
      }

      // Make detail text
      ImGui::TextWrapped("%s", warningDetailString.c_str());
      if (doIndent) {
        ImGui::Unindent(offset);
      }
    }

    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();

    // Nice text sizing
    if (warningRepeatString != "") {
      offset = (warningModalSize.x - warningRepeatTextSize.x) / 2.0 - 5;
      offset = std::max(offset, 0.0f);
      doIndent = offset > 0;
      if (doIndent) {
        ImGui::Indent(offset);
      }

      // Make detail text
      ImGui::TextWrapped("%s", warningRepeatString.c_str());
      if (doIndent) {
        ImGui::Unindent(offset);
      }

      ImGui::Spacing();
      ImGui::Spacing();
      ImGui::Spacing();
    }

    // Nice button sizing
    float buttonWidth = 120;
    float buttonOffset = (warningModalSize.x - buttonWidth) / 2.0;
    buttonOffset = std::max(buttonOffset, 0.0f);
    doIndent = buttonOffset > 0;
    if (doIndent) {
      ImGui::Indent(buttonOffset);
    }

    // Make a button
    if (ImGui::Button("This is fine.", ImVec2(buttonWidth, 0)) || ImGui::IsKeyPressed((int)' ')) {
      ImGui::CloseCurrentPopup();
      popContext();
    }
    if (ImGui::IsItemHovered()) ImGui::SetTooltip("(space to dismiss)");

    if (doIndent) {
      ImGui::Unindent(buttonOffset);
    }
  }

  ImGui::EndPopup();
  ImGui::PopStyleColor();

  // Window title
  ImGui::PopStyleVar();
}